

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridFourier.cpp
# Opt level: O0

void __thiscall TasGrid::GridFourier::setHierarchicalCoefficients(GridFourier *this,double *c)

{
  allocator<double> *paVar1;
  int a;
  int b;
  bool bVar2;
  uint uVar3;
  size_t sVar4;
  double *pdVar5;
  double *pdVar6;
  MultiIndexSet *this_00;
  StorageSet local_100;
  allocator<double> local_d1;
  undefined1 local_d0 [8];
  vector<double,_std::allocator<double>_> y;
  undefined1 local_b0 [8];
  vector<double,_std::allocator<double>_> x;
  vector<double,_std::allocator<double>_> local_90;
  Data2D<double> local_78;
  int local_50;
  int num_points;
  MultiIndexSet local_40;
  double *local_18;
  double *c_local;
  GridFourier *this_local;
  
  local_18 = c;
  c_local = (double *)this;
  clearGpuNodes(this);
  clearGpuCoefficients(this);
  bVar2 = MultiIndexSet::empty(&(this->super_BaseCanonicalGrid).points);
  if (bVar2) {
    this_00 = &(this->super_BaseCanonicalGrid).needed;
    MultiIndexSet::operator=(&(this->super_BaseCanonicalGrid).points,this_00);
    MultiIndexSet::MultiIndexSet(&local_40);
    MultiIndexSet::operator=(this_00,&local_40);
    MultiIndexSet::~MultiIndexSet(&local_40);
  }
  else {
    (*(this->super_BaseCanonicalGrid)._vptr_BaseCanonicalGrid[0x18])();
  }
  local_50 = MultiIndexSet::getNumIndexes(&(this->super_BaseCanonicalGrid).points);
  pdVar5 = local_18;
  a = (this->super_BaseCanonicalGrid).num_outputs;
  b = local_50 * 2;
  sVar4 = Utils::size_mult<int,int>(a,b);
  paVar1 = (allocator<double> *)
           ((long)&x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  ::std::allocator<double>::allocator(paVar1);
  ::std::vector<double,std::allocator<double>>::vector<double_const*,void>
            ((vector<double,std::allocator<double>> *)&local_90,pdVar5,pdVar5 + sVar4,paVar1);
  Data2D<double>::Data2D<int,int>(&local_78,a,b,&local_90);
  Data2D<double>::operator=(&this->fourier_coefs,&local_78);
  Data2D<double>::~Data2D(&local_78);
  ::std::vector<double,_std::allocator<double>_>::~vector(&local_90);
  ::std::allocator<double>::~allocator
            ((allocator<double> *)
             ((long)&x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  sVar4 = Utils::size_mult<int,int>((this->super_BaseCanonicalGrid).num_dimensions,local_50);
  paVar1 = (allocator<double> *)
           ((long)&y.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  ::std::allocator<double>::allocator(paVar1);
  ::std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_b0,sVar4,paVar1);
  ::std::allocator<double>::~allocator
            ((allocator<double> *)
             ((long)&y.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  sVar4 = Utils::size_mult<int,int>((this->super_BaseCanonicalGrid).num_outputs,local_50);
  ::std::allocator<double>::allocator(&local_d1);
  ::std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_d0,sVar4,&local_d1);
  ::std::allocator<double>::~allocator(&local_d1);
  pdVar5 = ::std::vector<double,_std::allocator<double>_>::data
                     ((vector<double,_std::allocator<double>_> *)local_b0);
  (*(this->super_BaseCanonicalGrid)._vptr_BaseCanonicalGrid[0xb])(this,pdVar5);
  pdVar5 = ::std::vector<double,_std::allocator<double>_>::data
                     ((vector<double,_std::allocator<double>_> *)local_b0);
  uVar3 = MultiIndexSet::getNumIndexes(&(this->super_BaseCanonicalGrid).points);
  pdVar6 = ::std::vector<double,_std::allocator<double>_>::data
                     ((vector<double,_std::allocator<double>_> *)local_d0);
  (*(this->super_BaseCanonicalGrid)._vptr_BaseCanonicalGrid[0x13])(this,pdVar5,(ulong)uVar3,pdVar6);
  StorageSet::StorageSet
            (&local_100,(this->super_BaseCanonicalGrid).num_outputs,local_50,
             (vector<double,_std::allocator<double>_> *)local_d0);
  StorageSet::operator=(&(this->super_BaseCanonicalGrid).values,&local_100);
  StorageSet::~StorageSet(&local_100);
  ::std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_d0);
  ::std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_b0);
  return;
}

Assistant:

void GridFourier::setHierarchicalCoefficients(const double c[]){
    // takes c to be length 2*num_outputs*num_points
    // first num_points*num_outputs are the real part; second num_points*num_outputs are the imaginary part
    clearGpuNodes();
    clearGpuCoefficients();
    if (points.empty()){
        points = std::move(needed);
        needed = MultiIndexSet();
    }else{
        clearRefinement();
    }
    auto num_points = points.getNumIndexes();
    fourier_coefs = Data2D<double>(num_outputs, 2 * num_points, std::vector<double>(c, c + Utils::size_mult(num_outputs, 2 * num_points)));

    std::vector<double> x(Utils::size_mult(num_dimensions, num_points));
    std::vector<double> y(Utils::size_mult(num_outputs,    num_points));

    getPoints(x.data());
    evaluateBatch(x.data(), points.getNumIndexes(), y.data()); // speed this up later

    values = StorageSet(num_outputs, num_points, std::move(y));

}